

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<double>::Write(TPZSkylMatrix<double> *this,TPZStream *buf,int withclassid)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  bool bVar4;
  int64_t nel;
  TPZVec<long> skyl;
  long local_38;
  TPZVec<long> local_30;
  
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZStream::Write<double>(buf,&this->fStorage);
  local_38 = 0;
  TPZVec<long>::TPZVec
            (&local_30,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1,&local_38);
  pdVar2 = (double *)(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  bVar4 = -1 < (long)pdVar2;
  if (pdVar2 != (double *)0x0) {
    pdVar2 = (this->fStorage).fStore;
  }
  if (bVar4) {
    ppdVar1 = (this->fElem).fStore;
    lVar3 = -1;
    do {
      local_30.fStore[lVar3 + 1] = (long)ppdVar1[lVar3 + 1] - (long)pdVar2 >> 3;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
  }
  local_38 = CONCAT44(local_30.fNElements._4_4_,(uint)local_30.fNElements);
  (*buf->_vptr_TPZStream[5])(buf,&local_38,1);
  if (local_38 != 0) {
    (*buf->_vptr_TPZStream[5])(buf,local_30.fStore,(ulong)(uint)local_30.fNElements);
  }
  local_30._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_30.fStore != (long *)0x0) {
    operator_delete__(local_30.fStore);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const
{
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    for (int64_t i=0; i<this->Rows()+1; i++) {
        skyl[i] = fElem[i] - ptr;
    }
    buf.Write( skyl);
}